

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParseInterleave(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlChar local_68 [8];
  char name [32];
  xmlNodePtr local_40;
  xmlNodePtr child;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict last;
  xmlRelaxNGDefinePtr_conflict def;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  cur = (xmlRelaxNGDefinePtr_conflict)0x0;
  ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlRelaxNGNewDefine(ctxt,node);
  if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    *(xmlRelaxNGType *)&ctxt_local->userData = XML_RELAXNG_INTERLEAVE;
    if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
      pxVar2 = xmlHashCreate(10);
      ctxt->interleaves = pxVar2;
    }
    if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
      xmlRngPErrMemory(ctxt,"create interleaves\n");
    }
    else {
      ctxt->nbInterleaves = ctxt->nbInterleaves + 1;
      snprintf((char *)local_68,0x20,"interleave%d");
      iVar1 = xmlHashAddEntry(ctxt->interleaves,local_68,ctxt_local);
      if (iVar1 < 0) {
        xmlRngPErr(ctxt,node,0x415,"Failed to add %s to hash table\n",local_68,(xmlChar *)0x0);
      }
    }
    local_40 = node->children;
    if (local_40 == (_xmlNode *)0x0) {
      xmlRngPErr(ctxt,node,0x418,"Element interleave is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
    for (; local_40 != (xmlNodePtr)0x0; local_40 = local_40->next) {
      if ((((local_40 == (xmlNodePtr)0x0) || (local_40->ns == (xmlNs *)0x0)) ||
          (local_40->type != XML_ELEMENT_NODE)) ||
         ((iVar1 = xmlStrEqual(local_40->name,"element"), iVar1 == 0 ||
          (iVar1 = xmlStrEqual(local_40->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
        child = (xmlNodePtr)xmlRelaxNGParsePattern(ctxt,local_40);
      }
      else {
        child = (xmlNodePtr)xmlRelaxNGParseElement(ctxt,local_40);
      }
      if (child != (xmlNodePtr)0x0) {
        child->prev = (_xmlNode *)ctxt_local;
        if (cur == (xmlRelaxNGDefinePtr_conflict)0x0) {
          ctxt_local->grammar = (xmlRelaxNGGrammarPtr_conflict)child;
        }
        else {
          cur->next = (xmlRelaxNGDefinePtr)child;
        }
        cur = (xmlRelaxNGDefinePtr_conflict)child;
      }
    }
  }
  return (xmlRelaxNGDefinePtr_conflict)ctxt_local;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseInterleave(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;
    xmlRelaxNGDefinePtr last = NULL, cur;
    xmlNodePtr child;

    def = xmlRelaxNGNewDefine(ctxt, node);
    if (def == NULL) {
        return (NULL);
    }
    def->type = XML_RELAXNG_INTERLEAVE;

    if (ctxt->interleaves == NULL)
        ctxt->interleaves = xmlHashCreate(10);
    if (ctxt->interleaves == NULL) {
        xmlRngPErrMemory(ctxt, "create interleaves\n");
    } else {
        char name[32];

        snprintf(name, 32, "interleave%d", ctxt->nbInterleaves++);
        if (xmlHashAddEntry(ctxt->interleaves, BAD_CAST name, def) < 0) {
            xmlRngPErr(ctxt, node, XML_RNGP_INTERLEAVE_ADD,
                       "Failed to add %s to hash table\n",
		       (const xmlChar *) name, NULL);
        }
    }
    child = node->children;
    if (child == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_INTERLEAVE_NO_CONTENT,
                   "Element interleave is empty\n", NULL, NULL);
    }
    while (child != NULL) {
        if (IS_RELAXNG(child, "element")) {
            cur = xmlRelaxNGParseElement(ctxt, child);
        } else {
            cur = xmlRelaxNGParsePattern(ctxt, child);
        }
        if (cur != NULL) {
            cur->parent = def;
            if (last == NULL) {
                def->content = last = cur;
            } else {
                last->next = cur;
                last = cur;
            }
        }
        child = child->next;
    }

    return (def);
}